

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_cm.c
# Opt level: O0

int isobusfs_srv_rx_cg_cm(isobusfs_srv_priv *priv,isobusfs_msg *msg)

{
  isobusfs_error err;
  isobusfs_srv_priv *in_RSI;
  isobusfs_srv_priv *in_RDI;
  int ret;
  isobusfs_cm_cl_to_fs_function func;
  isobusfs_msg *in_stack_000000f0;
  isobusfs_srv_priv *in_stack_000000f8;
  uint in_stack_ffffffffffffffd8;
  int local_4;
  
  err = isobusfs_buf_to_function((uint8_t *)in_RSI);
  if (err == ISOBUSFS_ERR_SUCCESS) {
    local_4 = isobusfs_srv_handle_ccm
                        ((isobusfs_srv_priv *)0x0,(isobusfs_msg *)(ulong)in_stack_ffffffffffffffd8);
  }
  else if (err == ISOBUSFS_ERR_ACCESS_DENIED) {
    local_4 = isobusfs_srv_property_res(in_RSI,(isobusfs_msg *)0x100000000);
  }
  else if ((err == ISOBUSFS_ERR_INVALID_ACCESS) && (2 < in_RDI->server_version)) {
    local_4 = isobusfs_srv_volume_status_resp(in_stack_000000f8,in_stack_000000f0);
  }
  else {
    isobusfs_srv_send_error(in_RDI,(isobusfs_msg *)in_RSI,err);
    isobusfs_log(2,"%s: unsupported function: %i","isobusfs_srv_rx_cg_cm",err);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int isobusfs_srv_rx_cg_cm(struct isobusfs_srv_priv *priv,
			  struct isobusfs_msg *msg)
{
	enum isobusfs_cm_cl_to_fs_function func =
		isobusfs_buf_to_function(msg->buf);
	int ret = 0;

	/* Process the received function code and delegate to appropriate
	 * handlers
	 */
	switch (func) {
	case ISOBUSFS_CM_F_CC_MAINTENANCE:
		ret = isobusfs_srv_handle_ccm(priv, msg);
		break;
	case ISOBUSFS_CM_GET_FS_PROPERTIES:
		ret = isobusfs_srv_property_res(priv, msg);
		break;
	case ISOBUSFS_CM_VOLUME_STATUS_REQ:
		if (priv->server_version < 3)
			goto not_supported;

		ret = isobusfs_srv_volume_status_resp(priv, msg);
		break;
	default:
		goto not_supported;
	}

	return ret;

not_supported:
	/* Handle unsupported functions */
	isobusfs_srv_send_error(priv, msg, ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);

	pr_warn("%s: unsupported function: %i", __func__, func);

	/* Not a critical error */
	return 0;
}